

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManDupAppend(Gia_Man_t *pNew,Gia_Man_t *pTwo)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Obj_t *pObj;
  ulong uVar3;
  int v;
  
  if (0 < pNew->nRegs) {
    pNew->nRegs = 0;
  }
  if (pNew->pHTable == (int *)0x0) {
    Gia_ManHashStart(pNew);
  }
  pTwo->pObjs->Value = 0;
  v = 1;
  do {
    if (pTwo->nObjs <= v) {
      return;
    }
    pObj = Gia_ManObj(pTwo,v);
    if (pObj == (Gia_Obj_t *)0x0) {
      return;
    }
    uVar2 = (uint)*(ulong *)pObj;
    uVar3 = *(ulong *)pObj & 0x1fffffff;
    if (uVar3 == 0x1fffffff || (int)uVar2 < 0) {
      if ((~uVar2 & 0x9fffffff) == 0) {
        uVar2 = Gia_ManAppendCi(pNew);
        goto LAB_00551366;
      }
      if ((int)uVar2 < 0 && (int)uVar3 != 0x1fffffff) {
        iVar1 = Gia_ObjFanin0Copy(pObj);
        uVar2 = Gia_ManAppendCo(pNew,iVar1);
        goto LAB_00551366;
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pObj);
      iLit1 = Gia_ObjFanin1Copy(pObj);
      uVar2 = Gia_ManAppendAnd(pNew,iVar1,iLit1);
LAB_00551366:
      pObj->Value = uVar2;
    }
    v = v + 1;
  } while( true );
}

Assistant:

void Gia_ManDupAppend( Gia_Man_t * pNew, Gia_Man_t * pTwo )
{
    Gia_Obj_t * pObj;
    int i;
    if ( pNew->nRegs > 0 )
        pNew->nRegs = 0;
    if ( pNew->pHTable == NULL )
        Gia_ManHashStart( pNew );
    Gia_ManConst0(pTwo)->Value = 0;
    Gia_ManForEachObj1( pTwo, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
}